

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O3

QAccessibleInterface * __thiscall
QAccessibleTable::cellAt(QAccessibleTable *this,int row,int column)

{
  QAccessibleObject *pQVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QAbstractItemView *this_00;
  QAbstractItemModel *pQVar5;
  QListView *this_01;
  QHeaderView *pQVar6;
  QHeaderView *pQVar7;
  QAccessibleInterface *pQVar8;
  QDebug *pQVar9;
  undefined8 in_R9;
  long in_FS_OFFSET;
  QModelIndex local_a0;
  char *local_88;
  QDebug local_80;
  Stream *local_78;
  undefined1 local_70 [8];
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  undefined1 local_60 [8];
  undefined8 local_58;
  undefined1 *puStack_50;
  QWidgetData *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &this->super_QAccessibleObject;
  (**(code **)(*(long *)&this->super_QAccessibleObject + 0x18))(pQVar1);
  this_00 = (QAbstractItemView *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  pQVar5 = QAbstractItemView::model(this_00);
  if (pQVar5 != (QAbstractItemModel *)0x0) {
    local_48 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QAbstractItemView::rootIndex(&local_a0,this_00);
    (**(code **)(*(long *)pQVar5 + 0x60))(&local_58,pQVar5,row,column,&local_a0,in_R9,this_00);
    if (((-1 < (int)local_58) && (iVar2 = local_58._4_4_, -1 < (long)local_58)) &&
       (local_48 != (QWidgetData *)0x0)) {
      if (this->m_role == List) {
        (**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
        QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
        this_01 = (QListView *)QMetaObject::cast((QObject *)&QListView::staticMetaObject);
        iVar3 = QListView::modelColumn(this_01);
        iVar4 = -1;
        if (iVar2 == iVar3) {
          iVar4 = (int)local_58;
        }
      }
      else {
        pQVar6 = verticalHeader(this);
        pQVar7 = horizontalHeader(this);
        iVar2 = (int)local_58 + 1;
        iVar4 = (**(code **)(*(long *)this + 0x58))(this);
        iVar4 = (uint)(pQVar6 != (QHeaderView *)0x0) + local_58._4_4_ +
                (iVar4 + (uint)(pQVar6 != (QHeaderView *)0x0)) *
                (iVar2 - (uint)(pQVar7 == (QHeaderView *)0x0));
      }
      pQVar8 = (QAccessibleInterface *)(**(code **)(*(long *)this + 0x100))(this,iVar4);
      goto LAB_00526d41;
    }
    local_a0.r = 2;
    local_a0._4_8_ = 0;
    local_a0._12_8_ = 0;
    local_a0.m.ptr._4_4_ = 0;
    local_88 = "default";
    QMessageLogger::warning();
    pQVar9 = QDebug::operator<<(&local_80,"QAccessibleTable::cellAt: invalid index: ");
    local_78 = pQVar9->stream;
    *(int *)(local_78 + 0x28) = *(int *)(local_78 + 0x28) + 1;
    ::operator<<((Stream *)local_70,(QModelIndex *)&local_78);
    pQVar9 = QDebug::operator<<((QDebug *)local_70," for ");
    local_68.ptr = (QAbstractItemModel *)pQVar9->stream;
    *(int *)((Stream *)local_68.ptr + 0x28) = *(int *)((Stream *)local_68.ptr + 0x28) + 1;
    ::operator<<((Stream *)local_60,(QWidget *)&local_68);
    QDebug::~QDebug((QDebug *)local_60);
    QDebug::~QDebug((QDebug *)&local_68);
    QDebug::~QDebug((QDebug *)local_70);
    QDebug::~QDebug((QDebug *)&local_78);
    QDebug::~QDebug(&local_80);
  }
  pQVar8 = (QAccessibleInterface *)0x0;
LAB_00526d41:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pQVar8;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleTable::cellAt(int row, int column) const
{
    const QAbstractItemView *theView = view();
    const QAbstractItemModel *theModel = theView->model();
    if (!theModel)
        return nullptr;
    Q_ASSERT(role() != QAccessible::List);
    Q_ASSERT(role() != QAccessible::Tree);
    QModelIndex index = theModel->index(row, column, theView->rootIndex());
    if (Q_UNLIKELY(!index.isValid())) {
        qWarning() << "QAccessibleTable::cellAt: invalid index: " << index << " for " << theView;
        return nullptr;
    }
    return child(logicalIndex(index));
}